

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O2

void __thiscall
TransactionContext_SequenceApiTestWithScript_Test::TestBody
          (TransactionContext_SequenceApiTestWithScript_Test *this)

{
  Script *this_00;
  bool bVar1;
  long lVar2;
  char *pcVar3;
  Amount AVar4;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Privkey> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  initializer_list<cfd::SignParameter> __l_02;
  AssertionResult gtest_ar_1;
  AssertHelper local_23f0;
  SigHashType sighash_type;
  ByteData256 sighash;
  OutPoint outpoint2;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  SignParameter sign2;
  ByteData signature2;
  ByteData tx;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  ByteData signature1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  SigHashType local_2278;
  SigHashType local_226c;
  SigHashType local_2260;
  SigHashType local_2254;
  OutPoint outpoint1;
  int64_t local_2220;
  AddressFactory factory;
  TransactionContext txc;
  SignParameter sign1;
  Address address;
  AssertionResult gtest_ar;
  undefined1 local_1f30 [24];
  undefined1 local_1f18 [72];
  SignParameter local_1ed0 [9];
  UtxoData local_1a58;
  UtxoData local_1568;
  UtxoData utxo2;
  UtxoData utxo3;
  Address address2;
  UtxoData utxo1;
  
  cfd::AddressFactory::AddressFactory(&factory,kRegtest);
  cfd::UtxoData::UtxoData(&utxo1);
  utxo1.block_height = 0;
  utxo1.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo2,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&utxo3);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&utxo2);
  cfd::core::Txid::operator=(&utxo1.txid,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  utxo1.vout = 0;
  std::__cxx11::string::string
            ((string *)&utxo2,"0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc"
             ,(allocator *)&utxo3);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&utxo2);
  cfd::core::Script::operator=(&utxo1.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,
             "210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac",
             (allocator *)&utxo3);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&utxo2);
  cfd::core::Script::operator=(&utxo1.redeem_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,"bcrt1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7qmyhh6w",
             (allocator *)&utxo3);
  cfd::AddressFactory::GetAddress((Address *)&gtest_ar,&factory,(string *)&utxo2);
  cfd::core::Address::operator=(&utxo1.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::assign((char *)&utxo1.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,10000000);
  utxo1.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo1.address_type = kP2wshAddress;
  std::__cxx11::string::string
            ((string *)&utxo2,"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",
             (allocator *)&address2);
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_ar,(string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo3,"020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281",
             (allocator *)&txc);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1f30,(string *)&utxo3);
  std::__cxx11::string::string
            ((string *)&address,"03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae"
             ,(allocator *)&sign2);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1f18,(string *)&address);
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&pubkeys,__l,(allocator_type *)&sign1);
  lVar2 = 0x30;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               (&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
             (allocator *)&address2);
  cfd::core::Privkey::FromWif((Privkey *)&gtest_ar,(string *)&utxo2,kTestnet,true);
  std::__cxx11::string::string
            ((string *)&utxo3,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt",
             (allocator *)&txc);
  cfd::core::Privkey::FromWif((Privkey *)(local_1f30 + 8),(string *)&utxo3,kTestnet,true);
  std::__cxx11::string::string
            ((string *)&address,"cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9",
             (allocator *)&sign2);
  cfd::core::Privkey::FromWif((Privkey *)(local_1f18 + 0x10),(string *)&address,kTestnet,true);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&gtest_ar;
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            (&privkeys,__l_00,(allocator_type *)&sign1);
  lVar2 = 0x40;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               (&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::~string((string *)&utxo2);
  cfd::UtxoData::UtxoData(&utxo2);
  utxo2.block_height = 0;
  utxo2.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo3,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             (allocator *)&address);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&utxo3);
  cfd::core::Txid::operator=(&utxo2.txid,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo3);
  utxo2.vout = 1;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript((Script *)&gtest_ar,2,&pubkeys,true);
  this_00 = &utxo2.redeem_script;
  cfd::core::Script::operator=(this_00,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  cfd::AddressFactory::CreateP2shAddress((Address *)&gtest_ar,&factory,this_00);
  cfd::core::Address::operator=(&utxo2.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  cfd::core::Address::GetLockingScript((Script *)&gtest_ar,&utxo2.address);
  cfd::core::Script::operator=(&utxo2.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::assign((char *)&utxo2.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,180000);
  utxo2.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo2.address_type = kP2shP2wshAddress;
  cfd::UtxoData::UtxoData(&utxo3);
  utxo3.block_height = 0;
  utxo3.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&address,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             (allocator *)&address2);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&address);
  cfd::core::Txid::operator=(&utxo3.txid,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  utxo3.vout = 2;
  std::__cxx11::string::string((string *)&address,"51",(allocator *)&address2);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&address);
  cfd::core::Script::operator=(&utxo3.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::assign((char *)&utxo3.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,10000);
  utxo3.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo3.address_type = kP2shAddress;
  std::__cxx11::string::string
            ((string *)&gtest_ar,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",(allocator *)&address2);
  cfd::core::Address::Address(&address,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",(allocator *)&txc);
  cfd::core::Address::Address(&address2,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::TransactionContext::TransactionContext(&txc,2,0);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&utxo1);
  cfd::UtxoData::UtxoData(&local_1a58,&utxo2);
  cfd::UtxoData::UtxoData(&local_1568,&utxo3);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l_01,(allocator_type *)&sign2);
  lVar2 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x4f0;
  } while (lVar2 != -0x4f0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInputs(&txc,&utxos);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x213,
               "Expected: txc.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::TransactionContext::AddTxOut(&txc,&address,&utxo1.amount);
  cfd::TransactionContext::AddTxOut(&txc,&address2,&utxo2.amount);
  cfd::core::ByteData::ByteData(&tx);
  cfd::core::OutPoint::OutPoint(&outpoint1,&utxo1.txid,utxo1.vout);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&gtest_ar,
               "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
               (allocator *)&sighash);
    cfd::core::Pubkey::Pubkey((Pubkey *)&outpoint2,(string *)&gtest_ar);
    std::__cxx11::string::string
              ((string *)&sign1,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
               (allocator *)&signature2);
    cfd::core::Privkey::FromWif((Privkey *)&sign2,(string *)&sign1,kTestnet,true);
    cfd::core::SigHashType::SigHashType(&local_2254);
    cfd::TransactionContext::SignWithKey
              (&txc,&outpoint1,(Pubkey *)&outpoint2,(Privkey *)&sign2,&local_2254,true,
               (ByteData256 *)0x0,(ByteData *)0x0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sign2);
    std::__cxx11::string::~string((string *)&sign1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint2);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&sign2,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
             ,0x21f,
             "Expected: txc.SignWithKey(outpoint1, Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::TransactionContext::Verify(&txc,&outpoint1);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&sign2,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
             ,0x221,
             "Expected: txc.Verify(outpoint1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::IgnoreVerify(&txc,&outpoint1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x222,
               "Expected: txc.IgnoreVerify(outpoint1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::core::OutPoint::OutPoint(&outpoint2,&utxo2.txid,utxo2.vout);
  cfd::core::SigHashType::SigHashType(&sighash_type);
  cfd::core::SigHashType::SigHashType(&local_2260,&sighash_type);
  cfd::TransactionContext::CreateSignatureHash
            ((ByteData *)&gtest_ar,&txc,&outpoint2,this_00,&local_2260,&utxo2.amount,kVersion0);
  cfd::core::ByteData256::ByteData256(&sighash,(ByteData *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  cfd::core::SignatureUtil::CalculateEcSignature
            (&signature2,&sighash,
             privkeys.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 2,true);
  cfd::core::SignatureUtil::CalculateEcSignature
            (&signature1,&sighash,
             privkeys.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 1,true);
  cfd::core::SigHashType::SigHashType(&local_226c,&sighash_type);
  cfd::SignParameter::SignParameter(&sign2,&signature2,true,&local_226c);
  cfd::SignParameter::SetRelatedPubkey
            (&sign2,pubkeys.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_start + 2);
  cfd::core::SigHashType::SigHashType(&local_2278,&sighash_type);
  cfd::SignParameter::SignParameter(&sign1,&signature1,true,&local_2278);
  cfd::SignParameter::SetRelatedPubkey
            (&sign1,pubkeys.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1);
  cfd::SignParameter::SignParameter((SignParameter *)&gtest_ar,&sign2);
  cfd::SignParameter::SignParameter(local_1ed0,&sign1);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&gtest_ar;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&signatures,__l_02,(allocator_type *)&gtest_ar_1);
  lVar2 = 0x78;
  do {
    cfd::SignParameter::~SignParameter((SignParameter *)(&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x78;
  } while (lVar2 != -0x78);
  cfd::TransactionContext::AddMultisigSign(&txc,&outpoint2,&signatures,this_00,utxo2.address_type);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Verify(&txc,&outpoint2);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x232,
               "Expected: txc.Verify(outpoint2) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,&utxo3.txid,utxo3.vout);
      cfd::TransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x235,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Verify(&txc);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x237,"Expected: txc.Verify() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx,&gtest_ar);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x239,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  AVar4 = cfd::TransactionContext::GetFeeAmount(&txc);
  gtest_ar_1._0_8_ = AVar4.amount_;
  gtest_ar_1.message_.ptr_._0_1_ = AVar4.ignore_check_;
  local_23f0.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_1);
  local_2220 = cfd::core::Amount::GetSatoshiValue(&utxo3.amount);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"txc.GetFeeAmount().GetSatoshiValue()",
             "utxo3.amount.GetSatoshiValue()",(long *)&local_23f0,&local_2220);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_23f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x23a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_23f0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_23f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,&tx);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"tx.GetHex().c_str()",
             "\"02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff0280969800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca0004004730440220329d9b55274f5d77bf9115a07e6272b28945edd846d06656812faf7bb8bbed0f0220306969ce3aa41efa9cdef778d3c649ff196876c6314fe9c9c5daa5edf4b60d10014730440220266222c9508b6f8cd558c6c6327debef845406072939b26d157b2de9f859dfab0220718f2a192eace2ba7a17a1faebfdde067d24185adb470ba45d16bf9c57ce3ecb016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000\""
             ,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff0280969800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca0004004730440220329d9b55274f5d77bf9115a07e6272b28945edd846d06656812faf7bb8bbed0f0220306969ce3aa41efa9cdef778d3c649ff196876c6314fe9c9c5daa5edf4b60d10014730440220266222c9508b6f8cd558c6c6327debef845406072939b26d157b2de9f859dfab0220718f2a192eace2ba7a17a1faebfdde067d24185adb470ba45d16bf9c57ce3ecb016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000"
            );
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_23f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x23b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_23f0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_23f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&signatures);
  cfd::SignParameter::~SignParameter(&sign1);
  cfd::SignParameter::~SignParameter(&sign2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
  cfd::core::Txid::~Txid(&outpoint2.txid_);
  cfd::core::Txid::~Txid(&outpoint1.txid_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::TransactionContext::~TransactionContext(&txc);
  cfd::core::Address::~Address(&address2);
  cfd::core::Address::~Address(&address);
  cfd::UtxoData::~UtxoData(&utxo3);
  cfd::UtxoData::~UtxoData(&utxo2);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector(&privkeys);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
  cfd::UtxoData::~UtxoData(&utxo1);
  cfd::AddressFactory::~AddressFactory(&factory);
  return;
}

Assistant:

TEST(TransactionContext, SequenceApiTestWithScript)
{
  AddressFactory factory(NetType::kRegtest);
  // Address1 (p2wsh on p2pk)
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc");
  utxo1.redeem_script = Script("210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac");
  utxo1.address = factory.GetAddress("bcrt1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7qmyhh6w");
  utxo1.descriptor = "wsh(pk(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2wshAddress;

  // Address2 (2 of 3 multisig)
  // pubkey1: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey1: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // pubkey2: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // privkey2: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  // pubkey3: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey3: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  std::vector<Pubkey> pubkeys = {
    Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
    Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
    Pubkey("03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae")
  };
  std::vector<Privkey> privkeys = {
    Privkey::FromWif("cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet),
    Privkey::FromWif("cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet),
    Privkey::FromWif("cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9", NetType::kTestnet)
  };
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 1;
  utxo2.redeem_script = ScriptUtil::CreateMultisigRedeemScript(2, pubkeys);
  utxo2.address = factory.CreateP2shAddress(utxo2.redeem_script);
  utxo2.locking_script = utxo2.address.GetLockingScript();
  utxo2.descriptor = "sh(wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wshAddress;

  // Address3 (OP_TRUE)
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo3.vout = 2;
  utxo3.locking_script = Script("51");
  // utxo3.address;
  utxo3.descriptor = "raw(51)";
  utxo3.amount = Amount(int64_t{10000});
  utxo3.address_type = AddressType::kP2shAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  TransactionContext txc(2, 0);
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  EXPECT_NO_THROW(txc.AddInputs(utxos));
  txc.AddTxOut(address, utxo1.amount);
  txc.AddTxOut(address2, utxo2.amount);

  ByteData tx;

  // sign1 -> fail -> ignore
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  EXPECT_THROW(txc.SignWithKey(outpoint1,
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)),
      CfdException);

  EXPECT_THROW(txc.Verify(outpoint1), CfdException);
  EXPECT_NO_THROW(txc.IgnoreVerify(outpoint1));

  // sign2 -> manual -> success
  OutPoint outpoint2(utxo2.txid, utxo2.vout);
  SigHashType sighash_type;
  ByteData256 sighash = ByteData256(txc.CreateSignatureHash(outpoint2,
      utxo2.redeem_script, sighash_type, utxo2.amount, WitnessVersion::kVersion0));
  ByteData signature2 = SignatureUtil::CalculateEcSignature(sighash, privkeys[2]);
  ByteData signature1 = SignatureUtil::CalculateEcSignature(sighash, privkeys[1]);
  SignParameter sign2(signature2, true, sighash_type);
  sign2.SetRelatedPubkey(pubkeys[2]);
  SignParameter sign1(signature1, true, sighash_type);
  sign1.SetRelatedPubkey(pubkeys[1]);
  std::vector<SignParameter> signatures = {sign2, sign1};
  txc.AddMultisigSign(
      outpoint2, signatures, utxo2.redeem_script, utxo2.address_type);
  EXPECT_NO_THROW(txc.Verify(outpoint2));

  // sign3 -> ok
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(txc.Verify());

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), utxo3.amount.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff0280969800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca0004004730440220329d9b55274f5d77bf9115a07e6272b28945edd846d06656812faf7bb8bbed0f0220306969ce3aa41efa9cdef778d3c649ff196876c6314fe9c9c5daa5edf4b60d10014730440220266222c9508b6f8cd558c6c6327debef845406072939b26d157b2de9f859dfab0220718f2a192eace2ba7a17a1faebfdde067d24185adb470ba45d16bf9c57ce3ecb016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000");
}